

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::FileDescriptor::CopyHeadingTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  pointer pcVar1;
  size_type sVar2;
  FeatureSet *from;
  FileOptions *this_00;
  FileOptions *pFVar3;
  FeatureSet *this_01;
  Arena *pAVar4;
  string_view value;
  string_view value_00;
  
  pcVar1 = (this->name_->_M_dataplus)._M_p;
  sVar2 = this->name_->_M_string_length;
  (proto->field_0)._impl_._has_bits_.has_bits_[0] =
       (proto->field_0)._impl_._has_bits_.has_bits_[0] | 1;
  pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar4 & 1) != 0) {
    pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
  }
  value._M_str = pcVar1;
  value._M_len = sVar2;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,pAVar4);
  sVar2 = this->package_->_M_string_length;
  if (sVar2 != 0) {
    pcVar1 = (this->package_->_M_dataplus)._M_p;
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 2;
    pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    value_00._M_str = pcVar1;
    value_00._M_len = sVar2;
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.package_,value_00,pAVar4);
  }
  if (this->edition_ == EDITION_PROTO3) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.syntax_,"proto3",pAVar4);
  }
  else if (999 < (int)this->edition_) {
    *(byte *)&proto->field_0 = *(byte *)&proto->field_0 | 4;
    pAVar4 = (Arena *)(proto->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)pAVar4 & 1) != 0) {
      pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.syntax_,"editions",pAVar4);
    FileDescriptorProto::set_edition(proto,this->edition_);
  }
  pFVar3 = this->options_;
  if (pFVar3 != (FileOptions *)_FileOptions_default_instance_) {
    this_00 = FileDescriptorProto::mutable_options(proto);
    FileOptions::CopyFrom(this_00,pFVar3);
  }
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    pFVar3 = FileDescriptorProto::mutable_options(proto);
    this_01 = FileOptions::mutable_features(pFVar3);
    FeatureSet::CopyFrom(this_01,from);
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyHeadingTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) {
    proto->set_package(package());
  }

  if (edition() == Edition::EDITION_PROTO3) {
    proto->set_syntax("proto3");
  } else if (!IsLegacyEdition(edition())) {
    proto->set_syntax("editions");
    proto->set_edition(edition());
  }

  if (&options() != &FileOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}